

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsAutoTableElement.cpp
# Opt level: O0

void __thiscall
FillCellHelper::FillCellHelper
          (FillCellHelper *this,QAbstractItemModel *tableModel,int section,Orientation orientation,
          QSize iconSz)

{
  byte bVar1;
  int value;
  QVariant local_a0;
  QVariant local_80;
  QFlag local_5c;
  QVariant local_58;
  Orientation local_28;
  int local_24;
  Orientation orientation_local;
  int section_local;
  QAbstractItemModel *tableModel_local;
  FillCellHelper *this_local;
  QSize iconSz_local;
  
  this->iconSize = iconSz;
  local_28 = orientation;
  local_24 = section;
  _orientation_local = tableModel;
  tableModel_local = (QAbstractItemModel *)this;
  this_local = (FillCellHelper *)iconSz;
  (**(code **)(*(long *)tableModel + 0xa0))(&this->cellDecoration,tableModel,section,orientation,1);
  (**(code **)(*(long *)_orientation_local + 0xa0))
            (&this->cellFont,_orientation_local,local_24,local_28,6);
  (**(code **)(*(long *)_orientation_local + 0xa0))
            (&local_58,_orientation_local,local_24,local_28,0);
  QVariant::toString();
  QVariant::~QVariant(&local_58);
  (**(code **)(*(long *)_orientation_local + 0xa0))
            (&this->foreground,_orientation_local,local_24,local_28,9);
  (**(code **)(*(long *)_orientation_local + 0xa0))
            (&this->background,_orientation_local,local_24,local_28,8);
  (**(code **)(*(long *)_orientation_local + 0xa0))
            (&local_80,_orientation_local,local_24,local_28,7);
  value = QVariant::toInt((bool *)&local_80);
  QFlag::QFlag(&local_5c,value);
  QFlags<Qt::AlignmentFlag>::QFlags(&this->alignment,local_5c);
  QVariant::~QVariant(&local_80);
  (**(code **)(*(long *)_orientation_local + 0xa0))
            (&this->decorationAlignment,_orientation_local,local_24,local_28,0x2d535fb1);
  (**(code **)(*(long *)_orientation_local + 0xa0))
            (&local_a0,_orientation_local,local_24,local_28,0x2d535fb2);
  bVar1 = QVariant::toBool();
  QVariant::~QVariant(&local_a0);
  this->nonBreakableLines = (bool)(bVar1 & 1);
  QSize::QSize(&this->span,1,1);
  QTextCursor::QTextCursor(&this->cellCursor);
  return;
}

Assistant:

FillCellHelper(QAbstractItemModel *tableModel, int section, Qt::Orientation orientation, QSize iconSz)
        : iconSize(iconSz)
        , cellDecoration(tableModel->headerData(section, orientation, Qt::DecorationRole))
        , cellFont(tableModel->headerData(section, orientation, Qt::FontRole))
        , cellText(tableModel->headerData(section, orientation, Qt::DisplayRole).toString())
        , foreground(tableModel->headerData(section, orientation, Qt::ForegroundRole))
        , background(tableModel->headerData(section, orientation, Qt::BackgroundRole))
        , alignment(Qt::Alignment(tableModel->headerData(section, orientation, Qt::TextAlignmentRole).toInt()))
        , decorationAlignment(tableModel->headerData(section, orientation, KDReports::AutoTableElement::DecorationAlignmentRole))
        , nonBreakableLines(tableModel->headerData(section, orientation, KDReports::AutoTableElement::NonBreakableLinesRole).toBool())
        , span(1, 1)
    {
    }